

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.hpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::AMFImporter(AMFImporter *this)

{
  AMFImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0104b400;
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)0x0;
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::list
            (&this->mNodeElement_List);
  this->mReader = (IrrXMLReader *)0x0;
  std::__cxx11::string::string((string *)&this->mUnit);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>::list
            (&this->mMaterial_Converted);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::list
            (&this->mTexture_Converted);
  return;
}

Assistant:

AMFImporter() AI_NO_EXCEPT
    : mNodeElement_Cur(nullptr)
    , mReader(nullptr) {
        // empty
    }